

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperOpFailure<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator>
          (internal *this,char *expr1,char *expr2,const_iterator *val1,const_iterator *val2,char *op
          )

{
  AssertionResult *pAVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  string local_98;
  string local_78;
  AssertionResult local_48;
  char *local_38;
  char *op_local;
  const_iterator *val2_local;
  const_iterator *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  local_38 = op;
  op_local = (char *)val2;
  val2_local = val1;
  val1_local = (const_iterator *)expr2;
  expr2_local = expr1;
  expr1_local = (char *)this;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_48,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_38);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x3a5454);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&val1_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  FormatForComparisonFailureMessage<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator>
            (&local_78,(internal *)val2_local,(const_iterator *)op_local,val1);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  FormatForComparisonFailureMessage<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator>
            (&local_98,(internal *)op_local,val2_local,val1);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  AssertionResult::~AssertionResult(&local_48);
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}